

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

int uv_tty_init(uv_loop_t *loop,uv_tty_t *tty,int fd,int readable)

{
  uv__stream_init(loop,(uv_stream_t *)tty,UV_TTY);
  if (readable == 0) {
    uv__stream_open((uv_stream_t *)tty,fd,0x40);
    *(byte *)&tty->flags = (byte)tty->flags | 0x80;
  }
  else {
    uv__nonblock(fd,1);
    uv__stream_open((uv_stream_t *)tty,fd,0x20);
  }
  tty->mode = 0;
  return 0;
}

Assistant:

int uv_tty_init(uv_loop_t* loop, uv_tty_t* tty, int fd, int readable) {
  uv__stream_init(loop, (uv_stream_t*)tty, UV_TTY);

#if defined(__APPLE__)
  {
    int err = uv__stream_try_select((uv_stream_t*) tty, &fd);
    if (err)
      return err;
  }
#endif /* defined(__APPLE__) */

  if (readable) {
    uv__nonblock(fd, 1);
    uv__stream_open((uv_stream_t*)tty, fd, UV_STREAM_READABLE);
  } else {
    /* Note: writable tty we set to blocking mode. */
    uv__stream_open((uv_stream_t*)tty, fd, UV_STREAM_WRITABLE);
    tty->flags |= UV_STREAM_BLOCKING;
  }

  tty->mode = 0;
  return 0;
}